

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O1

void Diligent::anon_unknown_61::ValidatePipelineResourceLayoutDesc
               (PipelineStateDesc *PSODesc,DeviceFeatures *Features)

{
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
  _Var1;
  ulong uVar2;
  ImmutableSamplerDesc *in_RCX;
  ImmutableSamplerDesc *pIVar3;
  ImmutableSamplerDesc *Args_1;
  SHADER_TYPE ShaderStages;
  SHADER_TYPE ShaderStages_00;
  SHADER_TYPE ShaderStages_01;
  SHADER_TYPE ShaderStages_02;
  SHADER_TYPE ShaderStages_03;
  SHADER_TYPE ShaderStages_04;
  SHADER_TYPE ShaderStages_05;
  SHADER_TYPE ShaderStages_06;
  ShaderResourceVariableDesc *pSVar4;
  Char **Args_6;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>_>
  pVar5;
  uint local_cc;
  string msg;
  String local_a0;
  char *local_80;
  char *local_78;
  DeviceFeatures *local_70;
  unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
  UniqueVariables;
  
  UniqueVariables._M_h._M_buckets = &UniqueVariables._M_h._M_single_bucket;
  UniqueVariables._M_h._M_bucket_count = 1;
  UniqueVariables._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  UniqueVariables._M_h._M_element_count = 0;
  UniqueVariables._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  UniqueVariables._M_h._M_rehash_policy._M_next_resize = 0;
  UniqueVariables._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_cc = 0;
  local_70 = Features;
  if ((PSODesc->ResourceLayout).NumVariables != 0) {
    do {
      pSVar4 = (PSODesc->ResourceLayout).Variables;
      uVar2 = (ulong)local_cc;
      pIVar3 = in_RCX;
      if (pSVar4[uVar2].Name == (Char *)0x0) {
        msg._M_dataplus._M_p = GetPipelineTypeString(PSODesc->PipelineType);
        local_a0._M_dataplus._M_p = (PSODesc->super_DeviceObjectAttribs).Name;
        if (local_a0._M_dataplus._M_p == (char *)0x0) {
          local_a0._M_dataplus._M_p = "";
        }
        pIVar3 = (ImmutableSamplerDesc *)0x1d9;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[26],unsigned_int,char[25]>
                  (false,"ValidatePipelineResourceLayoutDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x1d9,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6bf26c,
                   (char **)&local_a0,(char (*) [15])"\' is invalid: ",
                   (char (*) [26])"ResourceLayout.Variables[",&local_cc,
                   (char (*) [25])"].Name must not be null.");
      }
      pSVar4 = pSVar4 + uVar2;
      if (*pSVar4->Name == '\0') {
        msg._M_dataplus._M_p = GetPipelineTypeString(PSODesc->PipelineType);
        local_a0._M_dataplus._M_p = (PSODesc->super_DeviceObjectAttribs).Name;
        if (local_a0._M_dataplus._M_p == (char *)0x0) {
          local_a0._M_dataplus._M_p = "";
        }
        pIVar3 = (ImmutableSamplerDesc *)0x1dc;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[26],unsigned_int,char[26]>
                  (false,"ValidatePipelineResourceLayoutDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x1dc,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6bf26c,
                   (char **)&local_a0,(char (*) [15])"\' is invalid: ",
                   (char (*) [26])"ResourceLayout.Variables[",&local_cc,
                   (char (*) [26])"].Name must not be empty.");
      }
      if (pSVar4->ShaderStages == SHADER_TYPE_UNKNOWN) {
        msg._M_dataplus._M_p = GetPipelineTypeString(PSODesc->PipelineType);
        local_a0._M_dataplus._M_p = (PSODesc->super_DeviceObjectAttribs).Name;
        if (local_a0._M_dataplus._M_p == (char *)0x0) {
          local_a0._M_dataplus._M_p = "";
        }
        pIVar3 = (ImmutableSamplerDesc *)0x1df;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[26],unsigned_int,char[48]>
                  (false,"ValidatePipelineResourceLayoutDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x1df,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6bf26c,
                   (char **)&local_a0,(char (*) [15])"\' is invalid: ",
                   (char (*) [26])"ResourceLayout.Variables[",&local_cc,
                   (char (*) [48])"].ShaderStages must not be SHADER_TYPE_UNKNOWN.");
      }
      HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,pSVar4->Name,false);
      pVar5 = std::
              _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
              ::equal_range(&UniqueVariables._M_h,(key_type *)&msg);
      _Var1._M_cur = (__node_type *)
                     pVar5.first.
                     super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                     ._M_cur;
      if ((msg._M_dataplus._M_p != (pointer)0x0) && ((long)msg._M_string_length < 0)) {
        operator_delete__(msg._M_dataplus._M_p);
      }
      in_RCX = (ImmutableSamplerDesc *)&pSVar4->ShaderStages;
      for (; (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
              )_Var1._M_cur !=
             pVar5.second.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
             ._M_cur.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
          ; _Var1._M_cur = (__node_type *)((_Var1._M_cur)->super__Hash_node_base)._M_nxt) {
        if ((*(SHADER_TYPE *)
              ((long)&((_Var1._M_cur)->
                      super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                      ._M_storage._M_storage + 0x10) & *(SHADER_TYPE *)in_RCX) !=
            SHADER_TYPE_UNKNOWN) {
          local_78 = GetPipelineTypeString(PSODesc->PipelineType);
          local_80 = (PSODesc->super_DeviceObjectAttribs).Name;
          if (local_80 == (char *)0x0) {
            local_80 = "";
          }
          GetShaderStagesString_abi_cxx11_
                    (&msg,(Diligent *)(ulong)*(SHADER_TYPE *)in_RCX,ShaderStages);
          GetShaderStagesString_abi_cxx11_
                    (&local_a0,
                     (Diligent *)
                     (ulong)*(uint *)((long)&((_Var1._M_cur)->
                                             super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                                             ).
                                             super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                                             ._M_storage._M_storage + 0x10),ShaderStages_00);
          pIVar3 = (ImmutableSamplerDesc *)0x1e8;
          LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[18],char_const*,char[44],std::__cxx11::string,char[6],std::__cxx11::string,char[99]>
                    (false,"ValidatePipelineResourceLayoutDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x1e8,(char (*) [16])"Description of ",&local_78,(char (*) [7])0x6bf26c,
                     &local_80,(char (*) [15])"\' is invalid: ",(char (*) [18])"Shader variable \'",
                     &pSVar4->Name,(char (*) [44])"\' is defined in overlapping shader stages (",
                     &msg,(char (*) [6])0x7d051a,&local_a0,
                     (char (*) [99])
                     "). Multiple variables with the same name are allowed, but shader stages they use must not overlap."
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_70->SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED) {
          if (*(int *)((long)&((_Var1._M_cur)->
                              super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                              ._M_storage._M_storage + 0x10) == 0) {
            FormatString<char[26],char[34]>
                      (&msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"it->second != SHADER_TYPE_UNKNOWN",(char (*) [34])pIVar3);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"ValidatePipelineResourceLayoutDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x1ec);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          local_78 = GetPipelineTypeString(PSODesc->PipelineType);
          local_80 = (PSODesc->super_DeviceObjectAttribs).Name;
          if (local_80 == (char *)0x0) {
            local_80 = "";
          }
          GetShaderStagesString_abi_cxx11_
                    (&msg,(Diligent *)(ulong)*(SHADER_TYPE *)in_RCX,ShaderStages_01);
          GetShaderStagesString_abi_cxx11_
                    (&local_a0,
                     (Diligent *)
                     (ulong)*(uint *)((long)&((_Var1._M_cur)->
                                             super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                                             ).
                                             super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                                             ._M_storage._M_storage + 0x10),ShaderStages_02);
          pIVar3 = (ImmutableSamplerDesc *)0x1f2;
          LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[98],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[184]>
                    (false,"ValidatePipelineResourceLayoutDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x1f2,(char (*) [16])"Description of ",&local_78,(char (*) [7])0x6bf26c,
                     &local_80,(char (*) [15])"\' is invalid: ",
                     (char (*) [98])
                     "This device does not support separable programs, but there are separate resources with the name \'"
                     ,&pSVar4->Name,(char (*) [20])"\' in shader stages ",&msg,
                     (char (*) [6])0x7d051a,&local_a0,(char (*) [184])0x76fbcb);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::
      _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
      ::_M_emplace<char_const*const&,Diligent::SHADER_TYPE_const&>
                ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                  *)&UniqueVariables,0,pSVar4);
      local_cc = local_cc + 1;
    } while (local_cc < (PSODesc->ResourceLayout).NumVariables);
  }
  std::
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&UniqueVariables._M_h);
  UniqueVariables._M_h._M_buckets = &UniqueVariables._M_h._M_single_bucket;
  UniqueVariables._M_h._M_bucket_count = 1;
  UniqueVariables._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  UniqueVariables._M_h._M_element_count = 0;
  UniqueVariables._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  UniqueVariables._M_h._M_rehash_policy._M_next_resize = 0;
  UniqueVariables._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_cc = 0;
  if ((PSODesc->ResourceLayout).NumImmutableSamplers != 0) {
    do {
      pIVar3 = (PSODesc->ResourceLayout).ImmutableSamplers;
      uVar2 = (ulong)local_cc;
      Args_1 = in_RCX;
      if (pIVar3[uVar2].SamplerOrTextureName == (Char *)0x0) {
        msg._M_dataplus._M_p = GetPipelineTypeString(PSODesc->PipelineType);
        local_a0._M_dataplus._M_p = (PSODesc->super_DeviceObjectAttribs).Name;
        if (local_a0._M_dataplus._M_p == (char *)0x0) {
          local_a0._M_dataplus._M_p = "";
        }
        Args_1 = (ImmutableSamplerDesc *)0x1ff;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[34],unsigned_int,char[41]>
                  (false,"ValidatePipelineResourceLayoutDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x1ff,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6bf26c,
                   (char **)&local_a0,(char (*) [15])"\' is invalid: ",
                   (char (*) [34])"ResourceLayout.ImmutableSamplers[",&local_cc,
                   (char (*) [41])"].SamplerOrTextureName must not be null.");
      }
      Args_6 = &pIVar3[uVar2].SamplerOrTextureName;
      if (**Args_6 == '\0') {
        msg._M_dataplus._M_p = GetPipelineTypeString(PSODesc->PipelineType);
        local_a0._M_dataplus._M_p = (PSODesc->super_DeviceObjectAttribs).Name;
        if (local_a0._M_dataplus._M_p == (char *)0x0) {
          local_a0._M_dataplus._M_p = "";
        }
        Args_1 = (ImmutableSamplerDesc *)0x202;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[34],unsigned_int,char[42]>
                  (false,"ValidatePipelineResourceLayoutDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x202,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6bf26c,
                   (char **)&local_a0,(char (*) [15])"\' is invalid: ",
                   (char (*) [34])"ResourceLayout.ImmutableSamplers[",&local_cc,
                   (char (*) [42])"].SamplerOrTextureName must not be empty.");
      }
      in_RCX = pIVar3 + uVar2;
      if (in_RCX->ShaderStages == SHADER_TYPE_UNKNOWN) {
        msg._M_dataplus._M_p = GetPipelineTypeString(PSODesc->PipelineType);
        local_a0._M_dataplus._M_p = (PSODesc->super_DeviceObjectAttribs).Name;
        if (local_a0._M_dataplus._M_p == (char *)0x0) {
          local_a0._M_dataplus._M_p = "";
        }
        Args_1 = (ImmutableSamplerDesc *)0x205;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[34],unsigned_int,char[48]>
                  (false,"ValidatePipelineResourceLayoutDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x205,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6bf26c,
                   (char **)&local_a0,(char (*) [15])"\' is invalid: ",
                   (char (*) [34])"ResourceLayout.ImmutableSamplers[",&local_cc,
                   (char (*) [48])"].ShaderStages must not be SHADER_TYPE_UNKNOWN.");
      }
      HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,*Args_6,false);
      pVar5 = std::
              _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
              ::equal_range(&UniqueVariables._M_h,(key_type *)&msg);
      _Var1._M_cur = (__node_type *)
                     pVar5.first.
                     super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                     ._M_cur;
      if ((msg._M_dataplus._M_p != (pointer)0x0) && ((long)msg._M_string_length < 0)) {
        operator_delete__(msg._M_dataplus._M_p);
      }
      for (; (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
              )_Var1._M_cur !=
             pVar5.second.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
             ._M_cur.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
          ; _Var1._M_cur = (__node_type *)((_Var1._M_cur)->super__Hash_node_base)._M_nxt) {
        if ((*(SHADER_TYPE *)
              ((long)&((_Var1._M_cur)->
                      super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                      ._M_storage._M_storage + 0x10) & in_RCX->ShaderStages) != SHADER_TYPE_UNKNOWN)
        {
          local_78 = GetPipelineTypeString(PSODesc->PipelineType);
          local_80 = (PSODesc->super_DeviceObjectAttribs).Name;
          if (local_80 == (char *)0x0) {
            local_80 = "";
          }
          GetShaderStagesString_abi_cxx11_
                    (&msg,(Diligent *)(ulong)in_RCX->ShaderStages,ShaderStages_03);
          GetShaderStagesString_abi_cxx11_
                    (&local_a0,
                     (Diligent *)
                     (ulong)*(uint *)((long)&((_Var1._M_cur)->
                                             super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                                             ).
                                             super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                                             ._M_storage._M_storage + 0x10),ShaderStages_04);
          Args_1 = (ImmutableSamplerDesc *)0x20e;
          LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[20],char_const*,char[44],std::__cxx11::string,char[6],std::__cxx11::string,char[108]>
                    (false,"ValidatePipelineResourceLayoutDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x20e,(char (*) [16])"Description of ",&local_78,(char (*) [7])0x6bf26c,
                     &local_80,(char (*) [15])"\' is invalid: ",
                     (char (*) [20])"Immutable sampler \'",Args_6,
                     (char (*) [44])"\' is defined in overlapping shader stages (",&msg,
                     (char (*) [6])0x7d051a,&local_a0,
                     (char (*) [108])
                     "). Multiple immutable samplers with the same name are allowed, but shader stages they use must not overlap."
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_70->SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED) {
          if (*(int *)((long)&((_Var1._M_cur)->
                              super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                              ._M_storage._M_storage + 0x10) == 0) {
            FormatString<char[26],char[34]>
                      (&msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"it->second != SHADER_TYPE_UNKNOWN",(char (*) [34])Args_1);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"ValidatePipelineResourceLayoutDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x212);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          local_78 = GetPipelineTypeString(PSODesc->PipelineType);
          local_80 = (PSODesc->super_DeviceObjectAttribs).Name;
          if (local_80 == (char *)0x0) {
            local_80 = "";
          }
          GetShaderStagesString_abi_cxx11_
                    (&msg,(Diligent *)(ulong)in_RCX->ShaderStages,ShaderStages_05);
          GetShaderStagesString_abi_cxx11_
                    (&local_a0,
                     (Diligent *)
                     (ulong)*(uint *)((long)&((_Var1._M_cur)->
                                             super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                                             ).
                                             super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                                             ._M_storage._M_storage + 0x10),ShaderStages_06);
          Args_1 = (ImmutableSamplerDesc *)0x218;
          LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[107],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[192]>
                    (false,"ValidatePipelineResourceLayoutDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x218,(char (*) [16])"Description of ",&local_78,(char (*) [7])0x6bf26c,
                     &local_80,(char (*) [15])"\' is invalid: ",
                     (char (*) [107])
                     "This device does not support separable programs, but there are separate immutable samplers with the name \'"
                     ,Args_6,(char (*) [20])"\' in shader stages ",&msg,(char (*) [6])0x7d051a,
                     &local_a0,
                     (char (*) [192])
                     ". When separable programs are not supported, every resource is always shared between all stages. Use distinct immutable sampler names for each stage or define a single sampler for all stages."
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::
      _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
      ::_M_emplace<char_const*const&,Diligent::SHADER_TYPE_const&>
                ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                  *)&UniqueVariables,0,Args_6);
      local_cc = local_cc + 1;
    } while (local_cc < (PSODesc->ResourceLayout).NumImmutableSamplers);
  }
  std::
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&UniqueVariables._M_h);
  return;
}

Assistant:

void ValidatePipelineResourceLayoutDesc(const PipelineStateDesc& PSODesc, const DeviceFeatures& Features) noexcept(false)
{
    const PipelineResourceLayoutDesc& Layout = PSODesc.ResourceLayout;
    {
        std::unordered_multimap<HashMapStringKey, SHADER_TYPE> UniqueVariables;
        for (Uint32 i = 0; i < Layout.NumVariables; ++i)
        {
            const ShaderResourceVariableDesc& Var = Layout.Variables[i];

            if (Var.Name == nullptr)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.Variables[", i, "].Name must not be null.");

            if (Var.Name[0] == '\0')
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.Variables[", i, "].Name must not be empty.");

            if (Var.ShaderStages == SHADER_TYPE_UNKNOWN)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.Variables[", i, "].ShaderStages must not be SHADER_TYPE_UNKNOWN.");

            auto range = UniqueVariables.equal_range(Var.Name);
            for (auto it = range.first; it != range.second; ++it)
            {
                if ((it->second & Var.ShaderStages) != 0)
                {
                    LOG_PSO_ERROR_AND_THROW("Shader variable '", Var.Name, "' is defined in overlapping shader stages (", GetShaderStagesString(Var.ShaderStages),
                                            " and ", GetShaderStagesString(it->second),
                                            "). Multiple variables with the same name are allowed, but shader stages they use must not overlap.");
                }
                if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
                {
                    VERIFY_EXPR(it->second != SHADER_TYPE_UNKNOWN);
                    LOG_PSO_ERROR_AND_THROW("This device does not support separable programs, but there are separate resources with the name '",
                                            Var.Name, "' in shader stages ",
                                            GetShaderStagesString(Var.ShaderStages), " and ",
                                            GetShaderStagesString(it->second),
                                            ". When separable programs are not supported, every resource is always shared between all stages. "
                                            "Use distinct resource names for each stage or define a single resource for all stages.");
                }
            }
            UniqueVariables.emplace(Var.Name, Var.ShaderStages);
        }
    }
    {
        std::unordered_multimap<HashMapStringKey, SHADER_TYPE> UniqueSamplers;
        for (Uint32 i = 0; i < Layout.NumImmutableSamplers; ++i)
        {
            const ImmutableSamplerDesc& Sam = Layout.ImmutableSamplers[i];

            if (Sam.SamplerOrTextureName == nullptr)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.ImmutableSamplers[", i, "].SamplerOrTextureName must not be null.");

            if (Sam.SamplerOrTextureName[0] == '\0')
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.ImmutableSamplers[", i, "].SamplerOrTextureName must not be empty.");

            if (Sam.ShaderStages == SHADER_TYPE_UNKNOWN)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.ImmutableSamplers[", i, "].ShaderStages must not be SHADER_TYPE_UNKNOWN.");

            auto range = UniqueSamplers.equal_range(Sam.SamplerOrTextureName);
            for (auto it = range.first; it != range.second; ++it)
            {
                if ((it->second & Sam.ShaderStages) != 0)
                {
                    LOG_PSO_ERROR_AND_THROW("Immutable sampler '", Sam.SamplerOrTextureName, "' is defined in overlapping shader stages (", GetShaderStagesString(Sam.ShaderStages),
                                            " and ", GetShaderStagesString(it->second),
                                            "). Multiple immutable samplers with the same name are allowed, but shader stages they use must not overlap.");
                }
                if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
                {
                    VERIFY_EXPR(it->second != SHADER_TYPE_UNKNOWN);
                    LOG_PSO_ERROR_AND_THROW("This device does not support separable programs, but there are separate immutable samplers with the name '",
                                            Sam.SamplerOrTextureName, "' in shader stages ",
                                            GetShaderStagesString(Sam.ShaderStages), " and ",
                                            GetShaderStagesString(it->second),
                                            ". When separable programs are not supported, every resource is always shared between all stages. "
                                            "Use distinct immutable sampler names for each stage or define a single sampler for all stages.");
                }
            }
            UniqueSamplers.emplace(Sam.SamplerOrTextureName, Sam.ShaderStages);
        }
    }
}